

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

EventLoop * __thiscall EventLoopThreadPool::getNextLoop(EventLoopThreadPool *this)

{
  bool bVar1;
  reference ppEVar2;
  undefined8 *in_RDI;
  vector<EventLoop_*,_std::allocator<EventLoop_*>_> *unaff_retaddr;
  EventLoop *loop;
  value_type local_10;
  
  EventLoop::assertInLoopThread((EventLoop *)0x10d1aa);
  if ((*(byte *)(in_RDI + 1) & 1) != 0) {
    local_10 = (value_type)*in_RDI;
    bVar1 = std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::empty(unaff_retaddr);
    if (!bVar1) {
      ppEVar2 = std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::operator[]
                          ((vector<EventLoop_*,_std::allocator<EventLoop_*>_> *)(in_RDI + 6),
                           (long)*(int *)(in_RDI + 2));
      local_10 = *ppEVar2;
      *(int *)(in_RDI + 2) = (*(int *)(in_RDI + 2) + 1) % *(int *)((long)in_RDI + 0xc);
    }
    return local_10;
  }
  __assert_fail("started_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ruanyvan[P]WebServer/WebServer/EventLoopThreadPool.cpp"
                ,0x18,"EventLoop *EventLoopThreadPool::getNextLoop()");
}

Assistant:

EventLoop* EventLoopThreadPool::getNextLoop(){
    baseLoop_->assertInLoopThread();
    assert(started_);
    EventLoop* loop = baseLoop_;
    if(!loops_.empty()){
        loop = loops_[next_];
        next_ = (next_+1)%numThreads_;
    }
    return loop;
}